

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_mqtt_subscribe(mg_connection *nc,mg_mqtt_topic_expression *topics,size_t topics_len,
                      uint16_t message_id)

{
  void *buf;
  mg_mqtt_topic_expression *nc_00;
  size_t sVar1;
  uint16_t local_42;
  ulong uStack_40;
  uint16_t topic_len_n;
  size_t i;
  size_t sStack_30;
  uint16_t message_id_n;
  size_t old_len;
  size_t sStack_20;
  uint16_t message_id_local;
  size_t topics_len_local;
  mg_mqtt_topic_expression *topics_local;
  mg_connection *nc_local;
  
  sStack_30 = (nc->send_mbuf).len;
  old_len._6_2_ = message_id;
  sStack_20 = topics_len;
  topics_len_local = (size_t)topics;
  topics_local = (mg_mqtt_topic_expression *)nc;
  i._6_2_ = htons(message_id);
  mg_send((mg_connection *)topics_local,(void *)((long)&i + 6),2);
  for (uStack_40 = 0; uStack_40 < sStack_20; uStack_40 = uStack_40 + 1) {
    sVar1 = strlen(*(char **)(topics_len_local + uStack_40 * 0x10));
    local_42 = htons((uint16_t)sVar1);
    mg_send((mg_connection *)topics_local,&local_42,2);
    nc_00 = topics_local;
    buf = *(void **)(topics_len_local + uStack_40 * 0x10);
    sVar1 = strlen(*(char **)(topics_len_local + uStack_40 * 0x10));
    mg_send((mg_connection *)nc_00,buf,(int)sVar1);
    mg_send((mg_connection *)topics_local,(void *)(topics_len_local + uStack_40 * 0x10 + 8),1);
  }
  mg_mqtt_prepend_header
            ((mg_connection *)topics_local,'\b','\x02',(long)topics_local[6].topic - sStack_30);
  return;
}

Assistant:

void mg_mqtt_subscribe(struct mg_connection *nc,
                       const struct mg_mqtt_topic_expression *topics,
                       size_t topics_len, uint16_t message_id) {
    size_t old_len = nc->send_mbuf.len;

    uint16_t message_id_n = htons(message_id);
    size_t i;

    mg_send(nc, (char *) &message_id_n, 2);
    for (i = 0; i < topics_len; i++) {
        uint16_t topic_len_n = htons(strlen(topics[i].topic));
        mg_send(nc, &topic_len_n, 2);
        mg_send(nc, topics[i].topic, strlen(topics[i].topic));
        mg_send(nc, &topics[i].qos, 1);
    }

    mg_mqtt_prepend_header(nc, MG_MQTT_CMD_SUBSCRIBE, MG_MQTT_QOS(1),
                           nc->send_mbuf.len - old_len);
}